

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O1

void __thiscall NoiseSource::NoiseSource(NoiseSource *this,Time *time,int n)

{
  Noise **ppNVar1;
  ulong uVar2;
  double **ppdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Stochastic","");
  StochasticProcess::StochasticProcess(&this->super_StochasticProcess,time,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  RandN::RandN((RandN *)this);
  (this->super_StochasticProcess).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__NoiseSource_0015e2a8;
  (this->super_StochasticProcess).super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__NoiseSource_0015e330;
  (this->super_StochasticProcess).super_Physical._vptr_Physical =
       (_func_int **)&PTR__NoiseSource_0015e378;
  this->nNoises = n;
  uVar6 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar6 = (long)n * 8;
  }
  ppNVar1 = (Noise **)operator_new__(uVar6);
  this->aNoises = ppNVar1;
  uVar7 = (ulong)(uint)n;
  if (0 < n) {
    uVar2 = 0;
    do {
      this->aNoises[uVar2] = (Noise *)0x0;
      uVar2 = uVar2 + 1;
    } while (uVar7 != uVar2);
  }
  ppdVar3 = (double **)operator_new__(uVar6);
  this->aA = ppdVar3;
  if (0 < n) {
    uVar6 = 0;
    do {
      uVar2 = (long)this->nNoises * 8;
      if ((long)this->nNoises < 0) {
        uVar2 = 0xffffffffffffffff;
      }
      pdVar4 = (double *)operator_new__(uVar2);
      this->aA[uVar6] = pdVar4;
      uVar2 = (ulong)(uint)this->nNoises;
      if (0 < this->nNoises) {
        uVar5 = 0;
        do {
          dVar8 = 0.0;
          if (uVar6 == uVar5) {
            dVar8 = (double)(int)uVar2;
            if (dVar8 < 0.0) {
              dVar8 = sqrt(dVar8);
            }
            else {
              dVar8 = SQRT(dVar8);
            }
            dVar8 = 1.0 / dVar8;
          }
          this->aA[uVar6][uVar5] = dVar8;
          uVar5 = uVar5 + 1;
          uVar2 = (ulong)this->nNoises;
        } while ((long)uVar5 < (long)uVar2);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  }
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)this->nNoises) {
    uVar6 = (long)this->nNoises * 8;
  }
  pdVar4 = (double *)operator_new__(uVar6);
  this->aOmega = pdVar4;
  if (0 < n) {
    uVar6 = 0;
    do {
      dVar8 = RandN::dRandN((RandN *)this);
      this->aOmega[uVar6] = dVar8;
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  return;
}

Assistant:

NoiseSource::NoiseSource( Time *time,  int n )
	: StochasticProcess(time)
{
	nNoises = n;
	
	// noise array
	aNoises = new Noise *[nNoises];
	for(int i=0; i<n; i++)
		aNoises[i] = 0;
	
	// mixing array
	aA = new double *[nNoises];
	for(int i=0; i<n; i++) {
		aA[i] = new double[nNoises];
		for(int j=0; j<nNoises; j++)
			if (i==j)
				aA[i][j] = 1.0 / sqrt( double(nNoises) );
			else
				aA[i][j] = 0.0;
	}
	
	// omega array
	aOmega = new double[nNoises];
	for(int i=0; i<n; i++)
		aOmega[i] = dRandN();	
}